

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O0

void P_DoNewChaseDir(AActor *actor,double deltax,double deltay)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  TFlags<ActorFlag5,_unsigned_int> local_44;
  TFlags<ActorFlag5,_unsigned_int> local_40;
  byte local_3c [8];
  bool attempts [8];
  dirtype_t turnaround;
  dirtype_t olddir;
  int tdir;
  dirtype_t d [2];
  double deltay_local;
  double deltax_local;
  AActor *actor_local;
  
  d = (dirtype_t  [2])deltay;
  memset(local_3c,0,8);
  attempts._4_4_ = ZEXT14(actor->movedir);
  attempts._0_4_ = opposite[(uint)attempts._4_4_];
  if (deltax <= 10.0) {
    if (-10.0 <= deltax) {
      olddir = DI_NODIR;
    }
    else {
      olddir = DI_WEST;
    }
  }
  else {
    olddir = DI_EAST;
  }
  if (-10.0 <= (double)d) {
    if ((double)d <= 10.0) {
      tdir = 8;
    }
    else {
      tdir = 2;
    }
  }
  else {
    tdir = 6;
  }
  if (((olddir != DI_NODIR) && (tdir != 8)) &&
     (actor->movedir = (BYTE)diags[(int)((uint)((double)d < 0.0) * 2 + (uint)(0.0 < deltax))],
     (uint)actor->movedir != attempts._0_4_)) {
    local_3c[actor->movedir] = 1;
    bVar1 = P_TryWalk(actor);
    if (bVar1) {
      return;
    }
  }
  TFlags<ActorFlag5,_unsigned_int>::operator&
            (&local_40,
             (int)actor +
             (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_NODAMAGE|MF5_NOFORWARDFALL|MF5_NODROPOFF));
  uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_40);
  if (uVar2 == 0) {
    iVar3 = FRandom::operator()(&pr_newchasedir);
    if ((200 < iVar3) || (ABS(deltax) < ABS((double)d))) {
      swapvalues<dirtype_t>(&olddir,(dirtype_t *)&tdir);
    }
    if (olddir == attempts._0_4_) {
      olddir = DI_NODIR;
    }
    if (tdir == attempts._0_4_) {
      tdir = 8;
    }
  }
  if ((olddir != DI_NODIR) && ((local_3c[olddir] & 1) == 0)) {
    actor->movedir = (BYTE)olddir;
    local_3c[olddir] = 1;
    bVar1 = P_TryWalk(actor);
    if (bVar1) {
      return;
    }
  }
  if ((tdir != 8) && ((local_3c[(uint)tdir] & 1) == 0)) {
    actor->movedir = (BYTE)tdir;
    local_3c[(uint)tdir] = 1;
    bVar1 = P_TryWalk(actor);
    if (bVar1) {
      return;
    }
  }
  TFlags<ActorFlag5,_unsigned_int>::operator&
            (&local_44,
             (int)actor +
             (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_NODAMAGE|MF5_NOFORWARDFALL|MF5_NODROPOFF));
  uVar2 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_44);
  if (((uVar2 == 0) && (attempts._4_4_ != 8)) && ((local_3c[(uint)attempts._4_4_] & 1) == 0)) {
    actor->movedir = SUB41(attempts._4_4_,0);
    local_3c[(uint)attempts._4_4_] = 1;
    bVar1 = P_TryWalk(actor);
    if (bVar1) {
      return;
    }
  }
  uVar2 = FRandom::operator()(&pr_newchasedir);
  if ((uVar2 & 1) == 0) {
    for (turnaround = DI_SOUTHEAST; turnaround != ~DI_EAST; turnaround = turnaround - DI_NORTHEAST)
    {
      if ((turnaround != attempts._0_4_) && ((local_3c[(int)turnaround] & 1) == 0)) {
        actor->movedir = (BYTE)turnaround;
        local_3c[(int)turnaround] = 1;
        bVar1 = P_TryWalk(actor);
        if (bVar1) {
          return;
        }
      }
    }
  }
  else {
    for (turnaround = DI_EAST; (int)turnaround < 8; turnaround = turnaround + DI_NORTHEAST) {
      if ((turnaround != attempts._0_4_) && ((local_3c[(int)turnaround] & 1) == 0)) {
        actor->movedir = (BYTE)turnaround;
        local_3c[(int)turnaround] = 1;
        bVar1 = P_TryWalk(actor);
        if (bVar1) {
          return;
        }
      }
    }
  }
  if ((attempts._0_4_ != 8) && ((local_3c[(uint)attempts._0_4_] & 1) == 0)) {
    actor->movedir = SUB41(attempts._0_4_,0);
    bVar1 = P_TryWalk(actor);
    if (bVar1) {
      return;
    }
  }
  actor->movedir = '\b';
  return;
}

Assistant:

void P_DoNewChaseDir (AActor *actor, double deltax, double deltay)
{
	dirtype_t	d[2];
	int			tdir;
	dirtype_t	olddir, turnaround;
	bool		attempts[NUMDIRS-1]; // We don't need to attempt DI_NODIR.

	memset(&attempts, false, sizeof(attempts));
	olddir = (dirtype_t)actor->movedir;
	turnaround = opposite[olddir];

	if (deltax > 10)
		d[0] = DI_EAST;
	else if (deltax < -10)
		d[0] = DI_WEST;
	else
		d[0] = DI_NODIR;

	if (deltay < -10)
		d[1] = DI_SOUTH;
	else if (deltay>10)
		d[1] = DI_NORTH;
	else
		d[1] = DI_NODIR; 

	// try direct route
	if (d[0] != DI_NODIR && d[1] != DI_NODIR)
	{
		actor->movedir = diags[((deltay<0)<<1) + (deltax>0)];
		if (actor->movedir != turnaround)
		{
			attempts[actor->movedir] = true;
			if (P_TryWalk(actor))
				return;
		}
	}

	// try other directions
	if (!(actor->flags5 & MF5_AVOIDINGDROPOFF))
	{
		if ((pr_newchasedir() > 200 || fabs(deltay) > fabs(deltax)))
		{
			swapvalues (d[0], d[1]);
		}

		if (d[0] == turnaround)
			d[0] = DI_NODIR;
		if (d[1] == turnaround)
			d[1] = DI_NODIR;
	}
		
	if (d[0] != DI_NODIR && attempts[d[0]] == false)
	{
		actor->movedir = d[0];
		attempts[d[0]] = true;
		if (P_TryWalk (actor))
		{
			// either moved forward or attacked
			return;
		}
	}

	if (d[1] != DI_NODIR && attempts[d[1]] == false)
	{
		actor->movedir = d[1];
		attempts[d[1]] = true;
		if (P_TryWalk (actor))
			return;
	}

	if (!(actor->flags5 & MF5_AVOIDINGDROPOFF))
	{
		// there is no direct path to the player, so pick another direction.
		if (olddir != DI_NODIR && attempts[olddir] == false)
		{
			actor->movedir = olddir;
			attempts[olddir] = true;
			if (P_TryWalk (actor))
				return;
		}
	}

	// randomly determine direction of search
	if (pr_newchasedir() & 1)	
	{
		for (tdir = DI_EAST; tdir <= DI_SOUTHEAST; tdir++)
		{
			if (tdir != turnaround && attempts[tdir] == false)
			{
				actor->movedir = tdir;
				attempts[tdir] = true;
				if ( P_TryWalk(actor) )
					return;
			}
		}
	}
	else
	{
		for (tdir = DI_SOUTHEAST; tdir != (DI_EAST-1); tdir--)
		{
			if (tdir != turnaround && attempts[tdir] == false)
			{
				actor->movedir = tdir;
				attempts[tdir] = true;
				if ( P_TryWalk(actor) )
					return;
			}
		}
	}

	if (turnaround != DI_NODIR && attempts[turnaround] == false)
	{
		actor->movedir =turnaround;
		if ( P_TryWalk(actor) )
			return;
	}

	actor->movedir = DI_NODIR;	// cannot move
}